

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O2

int big2_cdataSectionTok(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte *pbVar1;
  byte bVar2;
  int iVar3;
  byte *pbVar4;
  char *pcVar5;
  ulong uVar6;
  long lVar7;
  bool bVar8;
  
  if (end <= ptr) {
    return -4;
  }
  uVar6 = (long)end - (long)ptr & 0xfffffffffffffffe;
  pcVar5 = ptr + uVar6;
  if (uVar6 == 0) {
    pcVar5 = end;
  }
  bVar8 = ((long)end - (long)ptr & 1U) != 0;
  if (!bVar8) {
    pcVar5 = end;
  }
  if (bVar8 && uVar6 == 0) {
    return -1;
  }
  bVar2 = *ptr;
  if (bVar2 - 0xd8 < 4) {
switchD_004f6bd0_caseD_7:
    if ((long)pcVar5 - (long)ptr < 4) {
      return -2;
    }
    pbVar4 = (byte *)(ptr + 4);
    goto LAB_004f6c34;
  }
  iVar3 = 0;
  pbVar4 = (byte *)ptr;
  if (bVar2 - 0xdc < 4) goto switchD_004f6bd0_caseD_0;
  if (bVar2 != 0) {
    if ((bVar2 == 0xff) && (0xfd < (byte)ptr[1])) goto switchD_004f6bd0_caseD_0;
    goto switchD_004f6bd0_caseD_2;
  }
  switch(*(undefined1 *)((long)enc[1].scanners + (ulong)(byte)ptr[1])) {
  case 0:
  case 1:
  case 8:
    goto switchD_004f6bd0_caseD_0;
  default:
    goto switchD_004f6bd0_caseD_2;
  case 4:
    pbVar4 = (byte *)(ptr + 2);
    if ((long)pcVar5 - (long)pbVar4 < 2) {
      return -1;
    }
    if ((*pbVar4 == 0) && (ptr[3] == ']')) {
      if ((long)pcVar5 - (long)(ptr + 4) < 2) {
        return -1;
      }
      if ((ptr[4] == '\0') && (ptr[5] == '>')) {
        iVar3 = 0x28;
        pbVar4 = (byte *)(ptr + 6);
        goto switchD_004f6bd0_caseD_0;
      }
    }
    break;
  case 5:
    if ((long)pcVar5 - (long)ptr < 2) {
      return -2;
    }
    goto switchD_004f6bd0_caseD_2;
  case 6:
    if ((long)pcVar5 - (long)ptr < 3) {
      return -2;
    }
    pbVar4 = (byte *)(ptr + 3);
    break;
  case 7:
    goto switchD_004f6bd0_caseD_7;
  case 9:
    pbVar1 = (byte *)(ptr + 2);
    if ((long)pcVar5 - (long)pbVar1 < 2) {
      return -1;
    }
    iVar3 = 7;
    pbVar4 = pbVar1;
    if ((*pbVar1 == 0) &&
       (pbVar4 = (byte *)(ptr + 4), *(char *)((long)enc[1].scanners + (ulong)(byte)ptr[3]) != '\n'))
    {
      pbVar4 = pbVar1;
    }
    goto switchD_004f6bd0_caseD_0;
  case 10:
    iVar3 = 7;
    pbVar4 = (byte *)(ptr + 2);
    goto switchD_004f6bd0_caseD_0;
  }
LAB_004f6c34:
  iVar3 = 6;
  for (; uVar6 = (long)pcVar5 - (long)pbVar4, 1 < (long)uVar6; pbVar4 = pbVar4 + lVar7) {
    bVar2 = *pbVar4;
    if (bVar2 - 0xd8 < 4) {
LAB_004f6c80:
      lVar7 = 4;
      if (uVar6 < 4) break;
    }
    else if (bVar2 == 0) {
      bVar2 = *(byte *)((long)enc[1].scanners + (ulong)pbVar4[1]);
      lVar7 = 2;
      if (bVar2 < 0xb) {
        if (bVar2 == 6) {
          lVar7 = 3;
          if (uVar6 == 2) break;
        }
        else {
          if (bVar2 == 7) goto LAB_004f6c80;
          lVar7 = 2;
          if ((0x713U >> (bVar2 & 0x1f) & 1) != 0) break;
        }
      }
    }
    else if (bVar2 == 0xff) {
      lVar7 = 2;
      if (0xfd < pbVar4[1]) break;
    }
    else {
      lVar7 = 2;
      if (bVar2 - 0xdc < 4) break;
    }
  }
switchD_004f6bd0_caseD_0:
  *nextTokPtr = (char *)pbVar4;
  return iVar3;
switchD_004f6bd0_caseD_2:
  pbVar4 = (byte *)(ptr + 2);
  goto LAB_004f6c34;
}

Assistant:

static int PTRCALL
PREFIX(cdataSectionTok)(const ENCODING *enc, const char *ptr,
                        const char *end, const char **nextTokPtr)
{
  if (ptr >= end)
    return XML_TOK_NONE;
  if (MINBPC(enc) > 1) {
    size_t n = end - ptr;
    if (n & (MINBPC(enc) - 1)) {
      n &= ~(MINBPC(enc) - 1);
      if (n == 0)
        return XML_TOK_PARTIAL;
      end = ptr + n;
    }
  }
  switch (BYTE_TYPE(enc, ptr)) {
  case BT_RSQB:
    ptr += MINBPC(enc);
    REQUIRE_CHAR(enc, ptr, end);
    if (!CHAR_MATCHES(enc, ptr, ASCII_RSQB))
      break;
    ptr += MINBPC(enc);
    REQUIRE_CHAR(enc, ptr, end);
    if (!CHAR_MATCHES(enc, ptr, ASCII_GT)) {
      ptr -= MINBPC(enc);
      break;
    }
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_CDATA_SECT_CLOSE;
  case BT_CR:
    ptr += MINBPC(enc);
    REQUIRE_CHAR(enc, ptr, end);
    if (BYTE_TYPE(enc, ptr) == BT_LF)
      ptr += MINBPC(enc);
    *nextTokPtr = ptr;
    return XML_TOK_DATA_NEWLINE;
  case BT_LF:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_DATA_NEWLINE;
  INVALID_CASES(ptr, nextTokPtr)
  default:
    ptr += MINBPC(enc);
    break;
  }
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
#define LEAD_CASE(n) \
    case BT_LEAD ## n: \
      if (end - ptr < n || IS_INVALID_CHAR(enc, ptr, n)) { \
        *nextTokPtr = ptr; \
        return XML_TOK_DATA_CHARS; \
      } \
      ptr += n; \
      break;
    LEAD_CASE(2) LEAD_CASE(3) LEAD_CASE(4)
#undef LEAD_CASE
    case BT_NONXML:
    case BT_MALFORM:
    case BT_TRAIL:
    case BT_CR:
    case BT_LF:
    case BT_RSQB:
      *nextTokPtr = ptr;
      return XML_TOK_DATA_CHARS;
    default:
      ptr += MINBPC(enc);
      break;
    }
  }
  *nextTokPtr = ptr;
  return XML_TOK_DATA_CHARS;
}